

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz.cpp
# Opt level: O0

ostream * ccs::anon_unknown_1::operator<<(ostream *os,Streamer *ss)

{
  char cVar1;
  bool bVar2;
  pointer ppVar3;
  reference pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  const_iterator cit;
  _Self local_28;
  const_iterator it;
  bool first;
  Streamer *ss_local;
  ostream *os_local;
  
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(ss->style);
  if (!bVar2) {
    it._M_node._7_1_ = 1;
    if ((ss->root & 1U) == 0) {
      std::operator<<(os,'[');
    }
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::cbegin(ss->style);
    while( true ) {
      cit._M_current =
           (char *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::cend(ss->style);
      bVar2 = std::operator!=(&local_28,(_Self *)&cit);
      if (!bVar2) break;
      if (((it._M_node._7_1_ & 1) == 0) && ((ss->root & 1U) == 0)) {
        std::operator<<(os,", ");
      }
      it._M_node._7_1_ = 0;
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_28);
      std::operator<<(os,(string *)ppVar3);
      std::operator<<(os,"=\"");
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_28);
      local_38._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->(&local_28);
        local_40._M_current = (char *)std::__cxx11::string::cend();
        bVar2 = __gnu_cxx::operator!=(&local_38,&local_40);
        if (!bVar2) break;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_38);
        cVar1 = *pcVar4;
        if (cVar1 == '\t') {
          std::operator<<(os,"\\t");
        }
        else if (cVar1 == '\n') {
          std::operator<<(os,"\\n");
        }
        else if (cVar1 == '\"') {
          std::operator<<(os,"\\\"");
        }
        else {
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_38);
          std::operator<<(os,*pcVar4);
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_38);
      }
      std::operator<<(os,'\"');
      if ((ss->root & 1U) != 0) {
        std::operator<<(os,";");
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_28);
    }
    if ((ss->root & 1U) == 0) {
      std::operator<<(os,']');
    }
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Streamer &ss) {
    if (!ss.style.empty()) {
      bool first = true;
      if (!ss.root) os << '[';
      for (auto it = ss.style.cbegin(); it != ss.style.cend(); ++it) {
        if (!first && !ss.root) os << ", ";
        first = false;
        os << it->first;
        os << "=\"";
        for (auto cit = it->second.cbegin(); cit != it->second.cend(); ++cit) {
          switch (*cit) {
            default: os << *cit; break;
            case '"': os << "\\\""; break;
            case '\n': os << "\\n"; break;
            case '\t': os << "\\t"; break;
          }
        }
        os << '"';
        if (ss.root) os << ";";
      }
      if (!ss.root) os << ']';
    }
    return os;
  }